

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

bool __thiscall
LowererMDArch::GenerateFastDivAndRem(LowererMDArch *this,Instr *instrDiv,LabelInstr *bailOutLabel)

{
  RegOpnd *opnd;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  RegOpnd *this_01;
  Instr *instr;
  
  if (instrDiv == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xc0f,"(instrDiv)","instrDiv");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_01 = (RegOpnd *)instrDiv->m_src1;
  if (((this_01->super_Opnd).m_type | TyInt64) == TyUint32) {
    opnd = (RegOpnd *)instrDiv->m_dst;
    this_00 = instrDiv->m_src2;
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)this_01);
    if (bVar2) {
      pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)this_01);
      bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar4,(Opnd *)opnd);
      if ((bVar2) &&
         ((instrDiv->m_opcode == Rem_I4 ||
          (bailOutLabel != (LabelInstr *)0x0 || instrDiv->m_opcode == RemU_I4)))) {
        this_01 = IR::RegOpnd::New(TyInt32,instrDiv->m_func);
        Lowerer::InsertMove(&this_01->super_Opnd,instrDiv->m_src1,instrDiv,true);
      }
    }
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,BitopsFastPathPhase,sourceContextId,functionId);
    if ((!bVar2) && (bVar2 = IR::Opnd::IsIntConstOpnd(this_00), bVar2)) {
      switch(instrDiv->m_opcode) {
      case Div_I4:
      case Rem_I4:
        bVar2 = GenerateFastDivAndRem_Signed(this,instrDiv);
        break;
      case DivU_I4:
      case RemU_I4:
        bVar2 = GenerateFastDivAndRem_Unsigned(this,instrDiv);
        break;
      default:
        goto switchD_005d1159_default;
      }
      if (bVar2 != false) {
        if ((instrDiv->m_opcode == Rem_I4) ||
           (bailOutLabel != (LabelInstr *)0x0 || instrDiv->m_opcode == RemU_I4)) {
          pRVar4 = opnd;
          if (bailOutLabel != (LabelInstr *)0x0) {
            pRVar4 = IR::RegOpnd::New(TyInt32,instrDiv->m_func);
          }
          instr = IR::Instr::New(IMUL2,&pRVar4->super_Opnd,(Opnd *)opnd,this_00,instrDiv->m_func);
          IR::Instr::InsertBefore(instrDiv,instr);
          LowererMD::Legalize<false>(instr,false);
          Lowerer::InsertSub(false,&pRVar4->super_Opnd,&this_01->super_Opnd,&pRVar4->super_Opnd,
                             instrDiv);
          if (bailOutLabel != (LabelInstr *)0x0) {
            Lowerer::InsertTestBranch
                      (&pRVar4->super_Opnd,&pRVar4->super_Opnd,BrNeq_A,bailOutLabel,instrDiv);
          }
        }
        IR::Instr::Remove(instrDiv);
        return true;
      }
    }
  }
switchD_005d1159_default:
  return false;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem(IR::Instr* instrDiv, IR::LabelInstr* bailOutLabel)
{
    Assert(instrDiv);
    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();

    if (divident->GetType() != TyInt32 && divident->GetType() != TyUint32)
    {
        return false;
    }

    if (divident->IsRegOpnd() && divident->AsRegOpnd()->IsSameRegUntyped(dst))
    {
        if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
        {
            divident = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
            Lowerer::InsertMove(divident, instrDiv->GetSrc1(), instrDiv);
        }
    }

    if (PHASE_OFF(Js::BitopsFastPathPhase, this->m_func) || !divisor->IsIntConstOpnd())
    {
        return false;
    }

    bool success = false;
    if (instrDiv->m_opcode == Js::OpCode::DivU_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4)
    {
        success = GenerateFastDivAndRem_Unsigned(instrDiv);
    }
    else if (instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)
    {
        success = GenerateFastDivAndRem_Signed(instrDiv);
    }

    if (!success)
    {
        return false;
    }
    // For reminder/mod ops
    if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
    {
        // For q = n/d
        // mul dst, dst, divident
        // sub dst, divident, dst
        IR::Opnd* reminderOpnd = dst;;
        if (bailOutLabel)
        {
            reminderOpnd = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
        }

        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, reminderOpnd, dst, divisor, instrDiv->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);
        Lowerer::InsertSub(false, reminderOpnd, divident, reminderOpnd, instrDiv);
        if (bailOutLabel)
        {
            Lowerer::InsertTestBranch(reminderOpnd, reminderOpnd, Js::OpCode::BrNeq_A, bailOutLabel, instrDiv);
        }
    }

    // DIV/REM has been optimized and can be removed now.
    instrDiv->Remove();
    return true;
}